

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

string * __thiscall
google::protobuf::io::(anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
          (CommentCollector *this)

{
  CommentCollector *this_local;
  
  if ((((byte)this[0x38] & 1) != 0) && (((byte)this[0x39] & 1) == 0)) {
    anon_unknown_4::CommentCollector::Flush((CommentCollector *)this);
  }
  this[0x38] = (CommentCollector)0x1;
  this[0x39] = (CommentCollector)0x1;
  return (string *)(this + 0x18);
}

Assistant:

string* GetBufferForLineComment() {
    // We want to combine with previous line comments, but not block comments.
    if (has_comment_ && !is_line_comment_) {
      Flush();
    }
    has_comment_ = true;
    is_line_comment_ = true;
    return &comment_buffer_;
  }